

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utf8.c
# Opt level: O0

_Bool dotest(char *file,int line,char *input,unsigned_long *chars,size_t nchars)

{
  unsigned_long *puVar1;
  size_t sVar2;
  unsigned_long uVar3;
  unsigned_long wc;
  char *before;
  size_t noutput;
  char *end;
  char *start;
  size_t nchars_local;
  unsigned_long *chars_local;
  char *input_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  
  chars_local = (unsigned_long *)input;
  input_local._4_4_ = line;
  pcStack_18 = file;
  sVar2 = strlen(input);
  before = (char *)0x0;
  printf("%s:%d: test start\n",pcStack_18,(ulong)input_local._4_4_);
  while( true ) {
    puVar1 = chars_local;
    if (input + sVar2 + 1 <= chars_local) {
      if (nchars <= before) {
        printf("%s:%d: pass\n",pcStack_18,(ulong)input_local._4_4_);
      }
      else {
        printf("%s:%d: FAIL: expected further output\n",pcStack_18,(ulong)input_local._4_4_);
      }
      return nchars <= before;
    }
    wc = (unsigned_long)chars_local;
    uVar3 = decode_utf8((char **)&chars_local);
    printf("%s:%d in+%zu out+%zu:",pcStack_18,(ulong)input_local._4_4_,(long)puVar1 - (long)input,
           before);
    while (wc < chars_local) {
      printf(" %02x",(ulong)*(byte *)wc);
      wc = wc + 1;
    }
    printf(" -> U-%08lx\n",uVar3);
    if (nchars <= before) break;
    if (chars[(long)before] != uVar3) {
      printf("%s:%d: FAIL: expected U-%08lx\n",pcStack_18,(ulong)input_local._4_4_,
             chars[(long)before]);
      return false;
    }
    before = before + 1;
  }
  printf("%s:%d: FAIL: expected no further output\n",pcStack_18,(ulong)input_local._4_4_);
  return false;
}

Assistant:

bool dotest(const char *file, int line, const char *input,
            const unsigned long *chars, size_t nchars)
{
    const char *start = input;
    const char *end = input + strlen(input) + 1;
    size_t noutput = 0;

    printf("%s:%d: test start\n", file, line);

    while (input < end) {
        const char *before = input;
        unsigned long wc = decode_utf8(&input);

        printf("%s:%d in+%"SIZEu" out+%"SIZEu":",
               file, line, (size_t)(before-start), noutput);
        while (before < input)
            printf(" %02x", (unsigned)(unsigned char)(*before++));
        printf(" -> U-%08lx\n", wc);

        if (noutput >= nchars) {
            printf("%s:%d: FAIL: expected no further output\n", file, line);
            return false;
        }

        if (chars[noutput] != wc) {
            printf("%s:%d: FAIL: expected U-%08lx\n",
                   file, line, chars[noutput]);
            return false;
        }

        noutput++;
    }

    if (noutput < nchars) {
        printf("%s:%d: FAIL: expected further output\n", file, line);
        return false;
    }

    printf("%s:%d: pass\n", file, line);
    return true;
}